

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_sparse.cpp
# Opt level: O1

void __thiscall
test_matrix_sparse_operator_matrix_subraction_assignement_Test::TestBody
          (test_matrix_sparse_operator_matrix_subraction_assignement_Test *this)

{
  initializer_list<double> value;
  initializer_list<double> value_00;
  initializer_list<double> value_01;
  DeathTest *pDVar1;
  DeathTest *pDVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  Scalar *pSVar6;
  char *pcVar7;
  StringLike<const_char_*> *regex;
  initializer_list<unsigned_long> non_zero;
  initializer_list<unsigned_long> non_zero_00;
  initializer_list<unsigned_long> non_zero_01;
  initializer_list<unsigned_long> index;
  initializer_list<unsigned_long> index_00;
  initializer_list<unsigned_long> index_01;
  Matrix_Sparse matrix_wrong_size;
  DeathTest *gtest_dt;
  Matrix_Sparse matrix;
  Matrix_Sparse identity;
  undefined1 local_1c8 [32];
  AssertHelper local_1a8;
  pointer puStack_1a0;
  pointer local_198;
  undefined1 local_188 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_180;
  pointer local_178;
  pointer puStack_170;
  DeathTest *local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  Matrix_Sparse local_118;
  DeathTest **local_c8;
  undefined8 uStack_c0;
  AssertHelper *local_b8;
  undefined8 uStack_b0;
  iterator local_a8;
  undefined8 uStack_a0;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_98;
  Matrix_Sparse local_80;
  
  local_118.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x2;
  local_118.column_index.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x3;
  local_118.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x1;
  local_188 = (undefined1  [8])0x0;
  pbStack_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  local_178 = (pointer)0x2;
  local_a8 = (iterator)local_1c8;
  local_1c8._0_8_ =
       (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )0x3ff0000000000000;
  local_1c8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3ff0000000000000;
  local_1c8._16_8_ = (pointer)0x3ff0000000000000;
  uStack_a0 = 3;
  value._M_len = 3;
  value._M_array = local_a8;
  non_zero._M_len = 4;
  non_zero._M_array = (iterator)&local_118;
  index._M_len = 3;
  index._M_array = (iterator)local_188;
  Disa::Matrix_Sparse::Matrix_Sparse(&local_80,non_zero,index,value,3);
  local_178 = (pointer)0x2;
  puStack_170 = (pointer)0x3;
  local_188 = (undefined1  [8])0x0;
  pbStack_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  local_1c8._0_8_ =
       (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )0x2;
  local_1c8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
  local_1c8._16_8_ = (pointer)0x0;
  local_b8 = &local_1a8;
  local_1a8.data_ = (AssertHelperData *)&DAT_4008000000000000;
  puStack_1a0 = (pointer)0xc010000000000000;
  local_198 = (pointer)0x4014000000000000;
  uStack_b0 = 3;
  value_00._M_len = 3;
  value_00._M_array = (iterator)local_b8;
  non_zero_00._M_len = 4;
  non_zero_00._M_array = (iterator)local_188;
  index_00._M_len = 3;
  index_00._M_array = (iterator)local_1c8;
  Disa::Matrix_Sparse::Matrix_Sparse(&local_118,non_zero_00,index_00,value_00,3);
  Disa::Matrix_Sparse::matrix_arithmetic<false>(&local_118,&local_80);
  local_1c8._0_8_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        )0x0;
  if (local_80.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_80.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_1c8._0_8_ =
         ((long)local_80.row_non_zero.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_80.row_non_zero.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start >> 3) + -1;
  }
  local_1a8.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_188,"identity.size_row()","3",(unsigned_long *)local_1c8,
             (int *)&local_1a8);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1c8);
    if (pbStack_180 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (pbStack_180->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x23e,pcVar7);
    testing::internal::AssertHelper::operator=(&local_1a8,(Message *)local_1c8);
    testing::internal::AssertHelper::~AssertHelper(&local_1a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1c8._0_8_ + 8))();
    }
  }
  if (pbStack_180 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_180,pbStack_180);
  }
  local_1c8._0_8_ = local_80.column_size;
  local_1a8.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_188,"identity.size_column()","3",(unsigned_long *)local_1c8,
             (int *)&local_1a8);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1c8);
    if (pbStack_180 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (pbStack_180->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x23f,pcVar7);
    testing::internal::AssertHelper::operator=(&local_1a8,(Message *)local_1c8);
    testing::internal::AssertHelper::~AssertHelper(&local_1a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1c8._0_8_ + 8))();
    }
  }
  if (pbStack_180 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_180,pbStack_180);
  }
  local_1c8._0_8_ =
       (long)local_80.column_index.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)local_80.column_index.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
             ._M_impl.super__Vector_impl_data._M_start >> 3;
  local_1a8.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_188,"identity.size_non_zero()","3",(unsigned_long *)local_1c8,
             (int *)&local_1a8);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1c8);
    if (pbStack_180 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (pbStack_180->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x240,pcVar7);
    testing::internal::AssertHelper::operator=(&local_1a8,(Message *)local_1c8);
    testing::internal::AssertHelper::~AssertHelper(&local_1a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1c8._0_8_ + 8))();
    }
  }
  if (pbStack_180 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_180,pbStack_180);
  }
  local_1c8._0_8_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        )0x0;
  if (local_118.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_118.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_1c8._0_8_ =
         ((long)local_118.row_non_zero.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_118.row_non_zero.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start >> 3) + -1;
  }
  local_1a8.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_188,"matrix.size_row()","3",(unsigned_long *)local_1c8,
             (int *)&local_1a8);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1c8);
    if (pbStack_180 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (pbStack_180->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x242,pcVar7);
    testing::internal::AssertHelper::operator=(&local_1a8,(Message *)local_1c8);
    testing::internal::AssertHelper::~AssertHelper(&local_1a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1c8._0_8_ + 8))();
    }
  }
  if (pbStack_180 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_180,pbStack_180);
  }
  local_1c8._0_8_ = local_118.column_size;
  local_1a8.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_188,"matrix.size_column()","3",(unsigned_long *)local_1c8,
             (int *)&local_1a8);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1c8);
    if (pbStack_180 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (pbStack_180->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x243,pcVar7);
    testing::internal::AssertHelper::operator=(&local_1a8,(Message *)local_1c8);
    testing::internal::AssertHelper::~AssertHelper(&local_1a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1c8._0_8_ + 8))();
    }
  }
  if (pbStack_180 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_180,pbStack_180);
  }
  local_1c8._0_8_ =
       (long)local_118.column_index.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_118.column_index.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start >> 3;
  local_1a8.data_._0_4_ = 5;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_188,"matrix.size_non_zero()","5",(unsigned_long *)local_1c8,
             (int *)&local_1a8);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1c8);
    if (pbStack_180 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (pbStack_180->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x244,pcVar7);
    testing::internal::AssertHelper::operator=(&local_1a8,(Message *)local_1c8);
    testing::internal::AssertHelper::~AssertHelper(&local_1a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1c8._0_8_ + 8))();
    }
  }
  if (pbStack_180 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_180,pbStack_180);
  }
  local_1a8.data_ = (AssertHelperData *)0x0;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_1c8,(size_t *)&local_118);
  local_138 = (DeathTest *)0x0;
  pSVar6 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_1c8,(size_t *)&local_138);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_188,"matrix[0][0]","-1.0",*pSVar6,-1.0);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1c8);
    if (pbStack_180 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (pbStack_180->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x245,pcVar7);
    testing::internal::AssertHelper::operator=(&local_1a8,(Message *)local_1c8);
    testing::internal::AssertHelper::~AssertHelper(&local_1a8);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_1c8._0_8_ !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(long *)local_1c8._0_8_ + 8))();
    }
  }
  if (pbStack_180 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_180,pbStack_180);
  }
  local_1a8.data_ = (AssertHelperData *)0x0;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_1c8,(size_t *)&local_118);
  local_138 = (DeathTest *)0x2;
  pSVar6 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_1c8,(size_t *)&local_138);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_188,"matrix[0][2]","3.0",*pSVar6,3.0);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1c8);
    if (pbStack_180 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (pbStack_180->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x246,pcVar7);
    testing::internal::AssertHelper::operator=(&local_1a8,(Message *)local_1c8);
    testing::internal::AssertHelper::~AssertHelper(&local_1a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1c8._0_8_ + 8))();
    }
  }
  if (pbStack_180 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_180,pbStack_180);
  }
  local_1a8.data_ = (AssertHelperData *)0x1;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_1c8,(size_t *)&local_118);
  local_138 = (DeathTest *)0x1;
  pSVar6 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_1c8,(size_t *)&local_138);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_188,"matrix[1][1]","-5.0",*pSVar6,-5.0);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1c8);
    if (pbStack_180 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (pbStack_180->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x247,pcVar7);
    testing::internal::AssertHelper::operator=(&local_1a8,(Message *)local_1c8);
    testing::internal::AssertHelper::~AssertHelper(&local_1a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1c8._0_8_ + 8))();
    }
  }
  if (pbStack_180 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_180,pbStack_180);
  }
  local_1a8.data_ = (AssertHelperData *)0x2;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_1c8,(size_t *)&local_118);
  local_138 = (DeathTest *)0x0;
  pSVar6 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_1c8,(size_t *)&local_138);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_188,"matrix[2][0]","5.0",*pSVar6,5.0);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1c8);
    if (pbStack_180 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (pbStack_180->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x248,pcVar7);
    testing::internal::AssertHelper::operator=(&local_1a8,(Message *)local_1c8);
    testing::internal::AssertHelper::~AssertHelper(&local_1a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1c8._0_8_ + 8))();
    }
  }
  if (pbStack_180 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_180,pbStack_180);
  }
  local_1a8.data_ = (AssertHelperData *)0x2;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_1c8,(size_t *)&local_118);
  local_138 = (DeathTest *)0x2;
  pSVar6 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_1c8,(size_t *)&local_138);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_188,"matrix[2][2]","-1.0",*pSVar6,-1.0);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1c8);
    if (pbStack_180 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (pbStack_180->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x249,pcVar7);
    testing::internal::AssertHelper::operator=(&local_1a8,(Message *)local_1c8);
    testing::internal::AssertHelper::~AssertHelper(&local_1a8);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_1c8._0_8_ !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(long *)local_1c8._0_8_ + 8))();
    }
  }
  if (pbStack_180 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_180,pbStack_180);
  }
  local_1c8._16_8_ = (pointer)0x2;
  local_1c8._24_8_ = (pointer)0x3;
  local_1c8._0_8_ =
       (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )0x0;
  local_1c8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
  local_1a8.data_ = (AssertHelperData *)0x2;
  puStack_1a0 = (pointer)0x1;
  local_198 = (pointer)0x0;
  local_138 = (DeathTest *)&DAT_4008000000000000;
  uStack_130 = 0xc010000000000000;
  local_128 = 0x4014000000000000;
  uStack_c0 = 3;
  value_01._M_len = 3;
  value_01._M_array = (iterator)&local_138;
  non_zero_01._M_len = 4;
  non_zero_01._M_array = (iterator)local_1c8;
  index_01._M_len = 3;
  index_01._M_array = (iterator)&local_1a8;
  local_c8 = &local_138;
  Disa::Matrix_Sparse::Matrix_Sparse((Matrix_Sparse *)local_188,non_zero_01,index_01,value_01,4);
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    local_1a8.data_ = (AssertHelperData *)0x169570;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)local_1c8,
               (testing *)&local_1a8,regex);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_98,(PolymorphicMatcher *)local_1c8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_);
    }
    bVar4 = testing::internal::DeathTest::Create
                      ("matrix -= matrix_wrong_size",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_98,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
                       ,0x24c,&local_138);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_98);
    pDVar1 = local_138;
    bVar3 = true;
    if (bVar4) {
      if (local_138 != (DeathTest *)0x0) {
        iVar5 = (*local_138->_vptr_DeathTest[2])(local_138);
        pDVar2 = local_138;
        if (iVar5 == 0) {
          iVar5 = (*local_138->_vptr_DeathTest[3])(local_138);
          bVar3 = testing::internal::ExitedUnsuccessfully(iVar5);
          iVar5 = (*pDVar2->_vptr_DeathTest[4])(pDVar2,(ulong)bVar3);
          if ((char)iVar5 != '\0') goto LAB_00124645;
          bVar3 = true;
          bVar4 = false;
        }
        else {
          if (iVar5 == 1) {
            bVar3 = testing::internal::AlwaysTrue();
            if (bVar3) {
              Disa::Matrix_Sparse::matrix_arithmetic<false>(&local_118,(Matrix_Sparse *)local_188);
            }
            (*local_138->_vptr_DeathTest[5])(local_138,2);
            (*pDVar2->_vptr_DeathTest[5])(pDVar2,0);
          }
LAB_00124645:
          bVar3 = false;
          bVar4 = true;
        }
        (*pDVar1->_vptr_DeathTest[1])(pDVar1);
        if (!bVar4) goto LAB_00124658;
      }
      bVar3 = false;
    }
LAB_00124658:
    if (!bVar3) goto LAB_001246b2;
  }
  testing::Message::Message((Message *)local_1c8);
  pcVar7 = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            (&local_1a8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
             ,0x24c,pcVar7);
  testing::internal::AssertHelper::operator=(&local_1a8,(Message *)local_1c8);
  testing::internal::AssertHelper::~AssertHelper(&local_1a8);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_1c8._0_8_ + 8))();
  }
LAB_001246b2:
  Disa::Matrix_Sparse::~Matrix_Sparse((Matrix_Sparse *)local_188);
  Disa::Matrix_Sparse::~Matrix_Sparse(&local_118);
  Disa::Matrix_Sparse::~Matrix_Sparse(&local_80);
  return;
}

Assistant:

TEST(test_matrix_sparse, operator_matrix_subraction_assignement) {
  Matrix_Sparse identity({0, 1, 2, 3}, {0, 1, 2}, {1.0, 1.0, 1.0}, 3);
  Matrix_Sparse matrix({0, 1, 2, 3}, {2, 1, 0}, {3.0, -4.0, 5.0}, 3);
  matrix -= identity;

  EXPECT_EQ(identity.size_row(), 3);
  EXPECT_EQ(identity.size_column(), 3);
  EXPECT_EQ(identity.size_non_zero(), 3);

  EXPECT_EQ(matrix.size_row(), 3);
  EXPECT_EQ(matrix.size_column(), 3);
  EXPECT_EQ(matrix.size_non_zero(), 5);
  EXPECT_DOUBLE_EQ(matrix[0][0], -1.0);
  EXPECT_DOUBLE_EQ(matrix[0][2], 3.0);
  EXPECT_DOUBLE_EQ(matrix[1][1], -5.0);
  EXPECT_DOUBLE_EQ(matrix[2][0], 5.0);
  EXPECT_DOUBLE_EQ(matrix[2][2], -1.0);

  Matrix_Sparse matrix_wrong_size({0, 1, 2, 3}, {2, 1, 0}, {3.0, -4.0, 5.0}, 4);
  EXPECT_DEATH(matrix -= matrix_wrong_size, "./*");
}